

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
* __thiscall
phmap::priv::
btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
::insert(pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
         *__return_storage_ptr__,
        btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
        *this,value_type *x)

{
  long *key;
  value_type *x_local;
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>_>
  *this_local;
  
  key = map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>
        ::key(x);
  btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
  ::insert_unique<std::pair<long_const,long>>
            (__return_storage_ptr__,
             (btree<phmap::priv::map_params<long,long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>,256,false>>
              *)this,key,x);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(value_type &&x) {
            return this->tree_.insert_unique(params_type::key(x), std::move(x));
        }